

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleMaskCorrectBit>::
createInstance(MSCase<vkt::pipeline::multisample::MSCaseSampleMaskCorrectBit> *this,Context *context
              )

{
  TestInstance *this_00;
  
  this_00 = (TestInstance *)operator_new(0x30);
  MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskCorrectBit>::MSInstance
            ((MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskCorrectBit> *)this_00,
             context,&(this->super_MSCaseBaseResolveAndPerSampleFetch).super_MultisampleCaseBase.
                      m_imageMSParams);
  return this_00;
}

Assistant:

TestInstance* MSCase<MSCaseSampleMaskCorrectBit>::createInstance (Context& context) const
{
	return new MSInstance<MSInstanceSampleMaskCorrectBit>(context, m_imageMSParams);
}